

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void init_macros(c2m_ctx_t c2m_ctx)

{
  VARR_token_t *pVVar1;
  pre_ctx_t ppVar2;
  token_t ptVar3;
  VARR_token_t *local_20;
  VARR_token_t *params;
  pre_ctx_t pre_ctx;
  c2m_ctx_t c2m_ctx_local;
  
  params = (VARR_token_t *)c2m_ctx->pre_ctx;
  pre_ctx = (pre_ctx_t)c2m_ctx;
  VARR_macro_tcreate(&((pre_ctx *)params)->macros,0x800);
  HTAB_macro_t_create((HTAB_macro_t **)&params->varr,0x800,macro_hash,macro_eq,
                      (_func_void_macro_t_void_ptr *)0x0,(void *)0x0);
  new_std_macro((c2m_ctx_t)pre_ctx,"__DATE__");
  new_std_macro((c2m_ctx_t)pre_ctx,"__TIME__");
  new_std_macro((c2m_ctx_t)pre_ctx,"__FILE__");
  new_std_macro((c2m_ctx_t)pre_ctx,"__LINE__");
  if ((int)pre_ctx->temp_tokens[1].size == 0) {
    VARR_token_tcreate(&local_20,1);
    pVVar1 = local_20;
    ptVar3 = new_id_token((c2m_ctx_t)pre_ctx,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40),"$"
                         );
    VARR_token_tpush(pVVar1,ptVar3);
    ppVar2 = pre_ctx;
    ptVar3 = new_id_token((c2m_ctx_t)pre_ctx,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40),
                          "__has_include");
    new_macro((c2m_ctx_t)ppVar2,ptVar3,local_20,(VARR_token_t *)0x0);
    VARR_token_tcreate(&local_20,1);
    pVVar1 = local_20;
    ptVar3 = new_id_token((c2m_ctx_t)pre_ctx,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40),"$"
                         );
    VARR_token_tpush(pVVar1,ptVar3);
    ppVar2 = pre_ctx;
    ptVar3 = new_id_token((c2m_ctx_t)pre_ctx,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40),
                          "__has_builtin");
    new_macro((c2m_ctx_t)ppVar2,ptVar3,local_20,(VARR_token_t *)0x0);
  }
  return;
}

Assistant:

static void init_macros (c2m_ctx_t c2m_ctx) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  VARR (token_t) * params;

  VARR_CREATE (macro_t, macros, 2048);
  HTAB_CREATE (macro_t, macro_tab, 2048, macro_hash, macro_eq, NULL);
  /* Standard macros : */
  new_std_macro (c2m_ctx, "__DATE__");
  new_std_macro (c2m_ctx, "__TIME__");
  new_std_macro (c2m_ctx, "__FILE__");
  new_std_macro (c2m_ctx, "__LINE__");
  if (!c2m_options->pedantic_p) {
    VARR_CREATE (token_t, params, 1);
    VARR_PUSH (token_t, params, new_id_token (c2m_ctx, no_pos, "$"));
    new_macro (c2m_ctx, new_id_token (c2m_ctx, no_pos, "__has_include"), params, NULL);
    VARR_CREATE (token_t, params, 1);
    VARR_PUSH (token_t, params, new_id_token (c2m_ctx, no_pos, "$"));
    new_macro (c2m_ctx, new_id_token (c2m_ctx, no_pos, "__has_builtin"), params, NULL);
  }
}